

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O2

int __thiscall henson::Array::copy(Array *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  void *pvVar1;
  variant<void_*,_float_*,_double_*,_int_*,_long_*> *extraout_RDX;
  variant<void_*,_float_*,_double_*,_int_*,_long_*> *extraout_RDX_00;
  variant<void_*,_float_*,_double_*,_int_*,_long_*> *vs;
  size_t i;
  ulong uVar2;
  __shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2> local_30;
  long local_20;
  
  local_20 = this->type * this->count;
  std::make_shared<std::vector<char,std::allocator<char>>,unsigned_long>((unsigned_long *)&local_30)
  ;
  std::__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->storage).
              super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  pvVar1 = void_ptr(this);
  vs = extraout_RDX;
  for (uVar2 = 0; uVar2 < this->count; uVar2 = uVar2 + 1) {
    vs = (variant<void_*,_float_*,_double_*,_int_*,_long_*> *)this->type;
    if (vs != (variant<void_*,_float_*,_double_*,_int_*,_long_*> *)0x0) {
      memmove((((this->storage).
                super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + (long)vs * uVar2,
              (void *)(this->stride * uVar2 + (long)pvVar1),(size_t)vs);
      vs = extraout_RDX_00;
    }
  }
  local_30._M_ptr =
       (element_type *)
       (((this->storage).
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  mpark::visit<henson::Array::replace_ptr,mpark::variant<void*,float*,double*,int*,long*>&>
            ((mpark *)&local_30,(replace_ptr *)this,vs);
  this->stride = this->type;
  return (int)this->type;
}

Assistant:

void    copy()
    {
        storage = std::make_shared<std::vector<char>>(count*type);
        char* char_ptr = static_cast<char*>(void_ptr());
        for (size_t i = 0; i < count; ++i)
            std::copy(char_ptr + i*stride, char_ptr + i*stride + type, storage->data() + i*type);
        visit(replace_ptr {storage->data()}, address);
        stride = type;
    }